

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O0

RenderBatch *
rlLoadRenderBatch(RenderBatch *__return_storage_ptr__,int numBuffers,int bufferElements)

{
  VertexBuffer *pVVar1;
  float *pfVar2;
  uchar *puVar3;
  uint *puVar4;
  DrawCall *pDVar5;
  RenderBatch *batch;
  int i_2;
  int i_1;
  int j_3;
  int k;
  int j_2;
  int j_1;
  int j;
  int i;
  int bufferElements_local;
  int numBuffers_local;
  
  memset(__return_storage_ptr__,0,0x20);
  pVVar1 = (VertexBuffer *)malloc((long)numBuffers * 0x48);
  __return_storage_ptr__->vertexBuffer = pVVar1;
  for (j_1 = 0; j_1 < numBuffers; j_1 = j_1 + 1) {
    __return_storage_ptr__->vertexBuffer[j_1].elementsCount = bufferElements;
    pfVar2 = (float *)malloc((long)(bufferElements * 0xc) << 2);
    __return_storage_ptr__->vertexBuffer[j_1].vertices = pfVar2;
    pfVar2 = (float *)malloc((long)(bufferElements << 3) << 2);
    __return_storage_ptr__->vertexBuffer[j_1].texcoords = pfVar2;
    puVar3 = (uchar *)malloc((long)(bufferElements << 4));
    __return_storage_ptr__->vertexBuffer[j_1].colors = puVar3;
    puVar4 = (uint *)malloc((long)(bufferElements * 6) << 2);
    __return_storage_ptr__->vertexBuffer[j_1].indices = puVar4;
    for (j_2 = 0; SBORROW4(j_2,bufferElements * 0xc) != j_2 + bufferElements * -0xc < 0;
        j_2 = j_2 + 1) {
      __return_storage_ptr__->vertexBuffer[j_1].vertices[j_2] = 0.0;
    }
    for (k = 0; k < bufferElements * 8; k = k + 1) {
      __return_storage_ptr__->vertexBuffer[j_1].texcoords[k] = 0.0;
    }
    for (j_3 = 0; j_3 < bufferElements * 0x10; j_3 = j_3 + 1) {
      __return_storage_ptr__->vertexBuffer[j_1].colors[j_3] = '\0';
    }
    i_1 = 0;
    for (i_2 = 0; SBORROW4(i_2,bufferElements * 6) != i_2 + bufferElements * -6 < 0; i_2 = i_2 + 6)
    {
      __return_storage_ptr__->vertexBuffer[j_1].indices[i_2] = i_1 << 2;
      __return_storage_ptr__->vertexBuffer[j_1].indices[i_2 + 1] = i_1 * 4 + 1;
      __return_storage_ptr__->vertexBuffer[j_1].indices[i_2 + 2] = i_1 * 4 + 2;
      __return_storage_ptr__->vertexBuffer[j_1].indices[i_2 + 3] = i_1 << 2;
      __return_storage_ptr__->vertexBuffer[j_1].indices[i_2 + 4] = i_1 * 4 + 2;
      __return_storage_ptr__->vertexBuffer[j_1].indices[i_2 + 5] = i_1 * 4 + 3;
      i_1 = i_1 + 1;
    }
    __return_storage_ptr__->vertexBuffer[j_1].vCounter = 0;
    __return_storage_ptr__->vertexBuffer[j_1].tcCounter = 0;
    __return_storage_ptr__->vertexBuffer[j_1].cCounter = 0;
  }
  TraceLog(3,"RLGL: Render batch vertex buffers loaded successfully in RAM (CPU)");
  for (batch._4_4_ = 0; batch._4_4_ < numBuffers; batch._4_4_ = batch._4_4_ + 1) {
    if ((RLGL.ExtSupported.vao & 1U) != 0) {
      (*glad_glGenVertexArrays)(1,&__return_storage_ptr__->vertexBuffer[batch._4_4_].vaoId);
      (*glad_glBindVertexArray)(__return_storage_ptr__->vertexBuffer[batch._4_4_].vaoId);
    }
    (*glad_glGenBuffers)(1,__return_storage_ptr__->vertexBuffer[batch._4_4_].vboId);
    (*glad_glBindBuffer)(0x8892,__return_storage_ptr__->vertexBuffer[batch._4_4_].vboId[0]);
    (*glad_glBufferData)
              (0x8892,(long)(bufferElements * 0xc) << 2,
               __return_storage_ptr__->vertexBuffer[batch._4_4_].vertices,0x88e8);
    (*glad_glEnableVertexAttribArray)(*RLGL.State.currentShader.locs);
    (*glad_glVertexAttribPointer)(*RLGL.State.currentShader.locs,3,0x1406,'\0',0,(void *)0x0);
    (*glad_glGenBuffers)(1,__return_storage_ptr__->vertexBuffer[batch._4_4_].vboId + 1);
    (*glad_glBindBuffer)(0x8892,__return_storage_ptr__->vertexBuffer[batch._4_4_].vboId[1]);
    (*glad_glBufferData)
              (0x8892,(long)(bufferElements << 3) << 2,
               __return_storage_ptr__->vertexBuffer[batch._4_4_].texcoords,0x88e8);
    (*glad_glEnableVertexAttribArray)(RLGL.State.currentShader.locs[1]);
    (*glad_glVertexAttribPointer)(RLGL.State.currentShader.locs[1],2,0x1406,'\0',0,(void *)0x0);
    (*glad_glGenBuffers)(1,__return_storage_ptr__->vertexBuffer[batch._4_4_].vboId + 2);
    (*glad_glBindBuffer)(0x8892,__return_storage_ptr__->vertexBuffer[batch._4_4_].vboId[2]);
    (*glad_glBufferData)
              (0x8892,(long)(bufferElements << 4),
               __return_storage_ptr__->vertexBuffer[batch._4_4_].colors,0x88e8);
    (*glad_glEnableVertexAttribArray)(RLGL.State.currentShader.locs[5]);
    (*glad_glVertexAttribPointer)(RLGL.State.currentShader.locs[5],4,0x1401,'\x01',0,(void *)0x0);
    (*glad_glGenBuffers)(1,__return_storage_ptr__->vertexBuffer[batch._4_4_].vboId + 3);
    (*glad_glBindBuffer)(0x8893,__return_storage_ptr__->vertexBuffer[batch._4_4_].vboId[3]);
    (*glad_glBufferData)
              (0x8893,(long)(bufferElements * 6) << 2,
               __return_storage_ptr__->vertexBuffer[batch._4_4_].indices,0x88e4);
  }
  TraceLog(3,"RLGL: Render batch vertex buffers loaded successfully in VRAM (GPU)");
  if ((RLGL.ExtSupported.vao & 1U) != 0) {
    (*glad_glBindVertexArray)(0);
  }
  pDVar5 = (DrawCall *)malloc(0x1000);
  __return_storage_ptr__->draws = pDVar5;
  for (batch._0_4_ = 0; (int)batch < 0x100; batch._0_4_ = (int)batch + 1) {
    __return_storage_ptr__->draws[(int)batch].mode = 7;
    __return_storage_ptr__->draws[(int)batch].vertexCount = 0;
    __return_storage_ptr__->draws[(int)batch].vertexAlignment = 0;
    __return_storage_ptr__->draws[(int)batch].textureId = RLGL.State.defaultTextureId;
  }
  __return_storage_ptr__->buffersCount = numBuffers;
  __return_storage_ptr__->drawsCounter = 1;
  __return_storage_ptr__->currentDepth = -1.0;
  return __return_storage_ptr__;
}

Assistant:

RenderBatch rlLoadRenderBatch(int numBuffers, int bufferElements)
{
    RenderBatch batch = { 0 };

#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    // Initialize CPU (RAM) vertex buffers (position, texcoord, color data and indexes)
    //--------------------------------------------------------------------------------------------
    batch.vertexBuffer = (VertexBuffer *)RL_MALLOC(sizeof(VertexBuffer)*numBuffers);

    for (int i = 0; i < numBuffers; i++)
    {
        batch.vertexBuffer[i].elementsCount = bufferElements;

        batch.vertexBuffer[i].vertices = (float *)RL_MALLOC(bufferElements*3*4*sizeof(float));        // 3 float by vertex, 4 vertex by quad
        batch.vertexBuffer[i].texcoords = (float *)RL_MALLOC(bufferElements*2*4*sizeof(float));       // 2 float by texcoord, 4 texcoord by quad
        batch.vertexBuffer[i].colors = (unsigned char *)RL_MALLOC(bufferElements*4*4*sizeof(unsigned char));   // 4 float by color, 4 colors by quad
#if defined(GRAPHICS_API_OPENGL_33)
        batch.vertexBuffer[i].indices = (unsigned int *)RL_MALLOC(bufferElements*6*sizeof(unsigned int));      // 6 int by quad (indices)
#endif
#if defined(GRAPHICS_API_OPENGL_ES2)
        batch.vertexBuffer[i].indices = (unsigned short *)RL_MALLOC(bufferElements*6*sizeof(unsigned short));  // 6 int by quad (indices)
#endif

        for (int j = 0; j < (3*4*bufferElements); j++) batch.vertexBuffer[i].vertices[j] = 0.0f;
        for (int j = 0; j < (2*4*bufferElements); j++) batch.vertexBuffer[i].texcoords[j] = 0.0f;
        for (int j = 0; j < (4*4*bufferElements); j++) batch.vertexBuffer[i].colors[j] = 0;

        int k = 0;

        // Indices can be initialized right now
        for (int j = 0; j < (6*bufferElements); j += 6)
        {
            batch.vertexBuffer[i].indices[j] = 4*k;
            batch.vertexBuffer[i].indices[j + 1] = 4*k + 1;
            batch.vertexBuffer[i].indices[j + 2] = 4*k + 2;
            batch.vertexBuffer[i].indices[j + 3] = 4*k;
            batch.vertexBuffer[i].indices[j + 4] = 4*k + 2;
            batch.vertexBuffer[i].indices[j + 5] = 4*k + 3;

            k++;
        }

        batch.vertexBuffer[i].vCounter = 0;
        batch.vertexBuffer[i].tcCounter = 0;
        batch.vertexBuffer[i].cCounter = 0;
    }

    TRACELOG(LOG_INFO, "RLGL: Render batch vertex buffers loaded successfully in RAM (CPU)");
    //--------------------------------------------------------------------------------------------

    // Upload to GPU (VRAM) vertex data and initialize VAOs/VBOs
    //--------------------------------------------------------------------------------------------
    for (int i = 0; i < numBuffers; i++)
    {
        if (RLGL.ExtSupported.vao)
        {
            // Initialize Quads VAO
            glGenVertexArrays(1, &batch.vertexBuffer[i].vaoId);
            glBindVertexArray(batch.vertexBuffer[i].vaoId);
        }

        // Quads - Vertex buffers binding and attributes enable
        // Vertex position buffer (shader-location = 0)
        glGenBuffers(1, &batch.vertexBuffer[i].vboId[0]);
        glBindBuffer(GL_ARRAY_BUFFER, batch.vertexBuffer[i].vboId[0]);
        glBufferData(GL_ARRAY_BUFFER, bufferElements*3*4*sizeof(float), batch.vertexBuffer[i].vertices, GL_DYNAMIC_DRAW);
        glEnableVertexAttribArray(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_POSITION]);
        glVertexAttribPointer(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_POSITION], 3, GL_FLOAT, 0, 0, 0);

        // Vertex texcoord buffer (shader-location = 1)
        glGenBuffers(1, &batch.vertexBuffer[i].vboId[1]);
        glBindBuffer(GL_ARRAY_BUFFER, batch.vertexBuffer[i].vboId[1]);
        glBufferData(GL_ARRAY_BUFFER, bufferElements*2*4*sizeof(float), batch.vertexBuffer[i].texcoords, GL_DYNAMIC_DRAW);
        glEnableVertexAttribArray(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_TEXCOORD01]);
        glVertexAttribPointer(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_TEXCOORD01], 2, GL_FLOAT, 0, 0, 0);

        // Vertex color buffer (shader-location = 3)
        glGenBuffers(1, &batch.vertexBuffer[i].vboId[2]);
        glBindBuffer(GL_ARRAY_BUFFER, batch.vertexBuffer[i].vboId[2]);
        glBufferData(GL_ARRAY_BUFFER, bufferElements*4*4*sizeof(unsigned char), batch.vertexBuffer[i].colors, GL_DYNAMIC_DRAW);
        glEnableVertexAttribArray(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_COLOR]);
        glVertexAttribPointer(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_COLOR], 4, GL_UNSIGNED_BYTE, GL_TRUE, 0, 0);

        // Fill index buffer
        glGenBuffers(1, &batch.vertexBuffer[i].vboId[3]);
        glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, batch.vertexBuffer[i].vboId[3]);
#if defined(GRAPHICS_API_OPENGL_33)
        glBufferData(GL_ELEMENT_ARRAY_BUFFER, bufferElements*6*sizeof(int), batch.vertexBuffer[i].indices, GL_STATIC_DRAW);
#endif
#if defined(GRAPHICS_API_OPENGL_ES2)
        glBufferData(GL_ELEMENT_ARRAY_BUFFER, bufferElements*6*sizeof(short), batch.vertexBuffer[i].indices, GL_STATIC_DRAW);
#endif
    }

    TRACELOG(LOG_INFO, "RLGL: Render batch vertex buffers loaded successfully in VRAM (GPU)");

    // Unbind the current VAO
    if (RLGL.ExtSupported.vao) glBindVertexArray(0);
    //--------------------------------------------------------------------------------------------

    // Init draw calls tracking system
    //--------------------------------------------------------------------------------------------
    batch.draws = (DrawCall *)RL_MALLOC(DEFAULT_BATCH_DRAWCALLS*sizeof(DrawCall));

    for (int i = 0; i < DEFAULT_BATCH_DRAWCALLS; i++)
    {
        batch.draws[i].mode = RL_QUADS;
        batch.draws[i].vertexCount = 0;
        batch.draws[i].vertexAlignment = 0;
        //batch.draws[i].vaoId = 0;
        //batch.draws[i].shaderId = 0;
        batch.draws[i].textureId = RLGL.State.defaultTextureId;
        //batch.draws[i].RLGL.State.projection = MatrixIdentity();
        //batch.draws[i].RLGL.State.modelview = MatrixIdentity();
    }

    batch.buffersCount = numBuffers;    // Record buffer count
    batch.drawsCounter = 1;             // Reset draws counter
    batch.currentDepth = -1.0f;         // Reset depth value
    //--------------------------------------------------------------------------------------------
#endif

    return batch;
}